

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TextureViewTestViewSampling::initParentTextureContents(TextureViewTestViewSampling *this)

{
  float *pfVar1;
  uint uVar2;
  float fVar3;
  GLuint GVar4;
  int iVar5;
  deUint32 dVar6;
  uint uVar7;
  uint uVar8;
  undefined4 extraout_var;
  void *pvVar10;
  TestError *this_00;
  uint uVar11;
  uint uVar12;
  uint n_mipmap;
  uint n_mipmap_00;
  ulong uVar13;
  char *pcVar14;
  uint n_sample;
  Vec4 reference_color;
  Vec4 reference_color_1;
  Vector<float,_4> local_50;
  Vector<float,_4> local_40;
  long lVar9;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar5);
  (**(code **)(lVar9 + 0xb8))(this->m_iteration_parent_texture_target,this->m_to_id);
  dVar6 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar6,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1579);
  uVar2 = this->m_iteration_parent_texture_target;
  if ((((uVar2 == 0x8c18) || (uVar2 == 0x8c1a)) || (uVar2 == 0x9009)) ||
     ((uVar2 == 0x9100 || (uVar2 == 0x9102)))) {
    uVar12 = (uint)(uVar2 == 0x9009) * 5 + 1;
    resetReferenceColorStorage
              (this,this->m_iteration_parent_texture_depth,uVar12,
               this->m_iteration_parent_texture_n_levels,this->m_max_color_texture_samples_gl_value)
    ;
    iVar5 = this->m_max_color_texture_samples_gl_value << 2;
    uVar13 = 0xffffffffffffffff;
    if (-1 < iVar5) {
      uVar13 = (long)iVar5 * 4;
    }
    pvVar10 = operator_new__(uVar13);
    (**(code **)(lVar9 + 0x1680))(this->m_per_sample_filler_po_id);
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"glUseProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x160a);
    for (uVar8 = 0; uVar8 < this->m_iteration_parent_texture_depth; uVar8 = uVar8 + 1) {
      for (uVar11 = 0; uVar11 != uVar12; uVar11 = uVar11 + 1) {
        for (n_mipmap_00 = 0; n_mipmap_00 < this->m_iteration_parent_texture_n_levels;
            n_mipmap_00 = n_mipmap_00 + 1) {
          if (this->m_iteration_parent_texture_target == 0x9100) {
            (**(code **)(lVar9 + 0x6a0))(0x8ca9,0x8ce0,0x9100,this->m_to_id,n_mipmap_00);
            dVar6 = (**(code **)(lVar9 + 0x800))();
            pcVar14 = "glFramebufferTexture2D() call failed.";
            iVar5 = 0x1627;
          }
          else {
            (**(code **)(lVar9 + 0x690))(0x8ca9,0x8ce0,this->m_to_id,n_mipmap_00);
            dVar6 = (**(code **)(lVar9 + 0x800))();
            pcVar14 = "glFramebufferTextureLayer() call failed.";
            iVar5 = 0x161d;
          }
          glu::checkError(dVar6,pcVar14,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,iVar5);
          uVar7 = 1;
          if ((uVar2 | 2) == 0x9102) {
            uVar7 = this->m_max_color_texture_samples_gl_value;
          }
          n_sample = 0;
          for (uVar13 = 0; (ulong)uVar7 << 2 != uVar13; uVar13 = uVar13 + 4) {
            getRandomReferenceColor((TextureViewTestViewSampling *)&reference_color);
            pfVar1 = (float *)((long)pvVar10 + (uVar13 & 0xffffffff) * 4);
            *(undefined8 *)pfVar1 = reference_color.m_data._0_8_;
            *(undefined8 *)(pfVar1 + 2) = reference_color.m_data._8_8_;
            tcu::Vector<float,_4>::Vector(&local_50,(Vector<float,_4> *)&reference_color);
            setReferenceColor(this,uVar8,uVar11,n_mipmap_00,n_sample,&local_50);
            n_sample = n_sample + 1;
          }
          (**(code **)(lVar9 + 0x15a8))
                    (this->m_per_sample_filler_po_reference_colors_location,uVar7,pvVar10);
          dVar6 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar6,"glUniform4fv() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0x163c);
          (**(code **)(lVar9 + 0x14f0))
                    (this->m_per_sample_filler_po_layer_id_location,uVar11 * 6 + uVar8);
          dVar6 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar6,"glUniform1i() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0x1642);
          (**(code **)(lVar9 + 0x538))(0,0,1);
          dVar6 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar6,"glDrawArrays() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0x1649);
        }
      }
    }
    operator_delete__(pvVar10);
  }
  else {
    reference_color.m_data[2] = 0.0;
    reference_color.m_data[3] = 0.0;
    reference_color.m_data[1] = 0.0;
    reference_color.m_data[0] = (float)uVar2;
    if (uVar2 == 0x8513) {
      reference_color.m_data[0] = 4.77408e-41;
      reference_color.m_data[1] = 4.77422e-41;
      reference_color.m_data[2] = 4.77436e-41;
      reference_color.m_data[3] = 4.7745e-41;
      uVar2 = 6;
    }
    else {
      uVar2 = 1;
    }
    resetReferenceColorStorage
              (this,this->m_iteration_parent_texture_depth,uVar2,
               this->m_iteration_parent_texture_n_levels,1);
    for (uVar13 = 0; uVar13 != uVar2; uVar13 = uVar13 + 1) {
      fVar3 = reference_color.m_data[uVar13];
      for (uVar12 = 0; uVar12 < this->m_iteration_parent_texture_depth; uVar12 = uVar12 + 1) {
        uVar11 = 0;
        GVar4 = this->m_iteration_parent_texture_n_levels;
        uVar8 = 0;
        if (fVar3 == 4.60733e-41) {
          uVar8 = uVar12;
        }
        for (; GVar4 - uVar8 != uVar11; uVar11 = uVar11 + 1) {
          if (((int)fVar3 - 0x84f5U < 0x26) &&
             ((0x3f00000001U >> ((ulong)((int)fVar3 - 0x84f5U) & 0x3f) & 1) != 0)) {
LAB_00ab087d:
            (**(code **)(lVar9 + 0x6a0))(0x8ca9,0x8ce0,fVar3,this->m_to_id);
            dVar6 = (**(code **)(lVar9 + 0x800))();
            pcVar14 = "glFramebufferTexture2D() call failed.";
            iVar5 = 0x15cb;
          }
          else if (fVar3 == 4.60733e-41) {
            (**(code **)(lVar9 + 0x6a8))(0x8ca9,0x8ce0,0x806f,this->m_to_id,uVar11,uVar12);
            dVar6 = (**(code **)(lVar9 + 0x800))();
            pcVar14 = "glFramebufferTexture3D() call failed.";
            iVar5 = 0x15d4;
          }
          else {
            if (fVar3 == 4.97881e-42) goto LAB_00ab087d;
            if (fVar3 != 4.97741e-42) {
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,"Unrecognized texture target",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                         ,0x15da);
              __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
            (**(code **)(lVar9 + 0x698))(0x8ca9,0x8ce0,0xde0,this->m_to_id);
            dVar6 = (**(code **)(lVar9 + 0x800))();
            pcVar14 = "glFramebufferTexture1D() call failed.";
            iVar5 = 0x15bb;
          }
          glu::checkError(dVar6,pcVar14,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,iVar5);
          getRandomReferenceColor((TextureViewTestViewSampling *)&reference_color_1);
          tcu::Vector<float,_4>::Vector(&local_40,(Vector<float,_4> *)&reference_color_1);
          setReferenceColor(this,uVar12,(uint)uVar13,uVar11,0,&local_40);
          (**(code **)(lVar9 + 0x1c0))
                    (reference_color_1.m_data[0],reference_color_1.m_data[1],
                     reference_color_1.m_data[2],reference_color_1.m_data[3]);
          dVar6 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar6,"glClearColor() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0x15e7);
          (**(code **)(lVar9 + 0x188))(0x4000);
          dVar6 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar6,"glClear() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0x15ea);
        }
      }
    }
  }
  return;
}

Assistant:

void TextureViewTestViewSampling::initParentTextureContents()
{
	static const glw::GLenum cm_texture_targets[] = {
		/* NOTE: This order must match the order used for sampling CM/CMA texture targets. */
		GL_TEXTURE_CUBE_MAP_POSITIVE_X, GL_TEXTURE_CUBE_MAP_NEGATIVE_X, GL_TEXTURE_CUBE_MAP_POSITIVE_Y,
		GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, GL_TEXTURE_CUBE_MAP_POSITIVE_Z, GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
	};
	static const unsigned int n_cm_texture_targets = sizeof(cm_texture_targets) / sizeof(cm_texture_targets[0]);
	const glw::Functions&	 gl				   = m_context.getRenderContext().getFunctions();

	/* Bind the parent texture */
	gl.bindTexture(m_iteration_parent_texture_target, m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	/* If we're dealing with a single-sampled texture target, then we can clear the
	 * contents of each layer/face/slice using FBO. This will unfortunately not work
	 * for arrayed textures, layers or layer-faces of which cannot be attached to a draw
	 * framebuffer.
	 * If we need to update contents of a multisampled, potentially arrayed texture,
	 * we'll need to use the filler program.
	 **/
	bool is_arrayed_texture_target = (m_iteration_parent_texture_target == GL_TEXTURE_1D_ARRAY ||
									  m_iteration_parent_texture_target == GL_TEXTURE_2D_ARRAY ||
									  m_iteration_parent_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY);
	bool is_multisampled_texture_target = (m_iteration_parent_texture_target == GL_TEXTURE_2D_MULTISAMPLE ||
										   m_iteration_parent_texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY);

	if (!is_arrayed_texture_target && !is_multisampled_texture_target)
	{
		/* Good, no need to work with samples! */
		DE_ASSERT(m_iteration_parent_texture_depth >= 1);
		DE_ASSERT(m_iteration_parent_texture_n_levels >= 1);

		/* Cube-map texture target cannot be directly used for a glFramebufferTexture2D() call. Instead,
		 * we need to split it into 6 cube-map texture targets. */
		unsigned int n_texture_targets					   = 1;
		glw::GLenum  texture_targets[n_cm_texture_targets] = {
			m_iteration_parent_texture_target, GL_NONE, GL_NONE, GL_NONE, GL_NONE, GL_NONE,
		};

		if (m_iteration_parent_texture_target == GL_TEXTURE_CUBE_MAP)
		{
			DE_STATIC_ASSERT(sizeof(texture_targets) == sizeof(cm_texture_targets));
			memcpy(texture_targets, cm_texture_targets, sizeof(cm_texture_targets));

			n_texture_targets = n_cm_texture_targets;
		}

		resetReferenceColorStorage(m_iteration_parent_texture_depth,	/* n_layers */
								   n_texture_targets,					/* n_faces */
								   m_iteration_parent_texture_n_levels, /* n_mipmaps */
								   1);									/* n_samples */

		/* Iterate through all texture targets we need to update */
		for (unsigned int n_texture_target = 0; n_texture_target < n_texture_targets; ++n_texture_target)
		{
			const glw::GLenum texture_target = texture_targets[n_texture_target];

			/* Iterate through all layers of the texture. */
			for (unsigned int n_layer = 0; n_layer < m_iteration_parent_texture_depth; ++n_layer)
			{
				/* ..and mip-maps, too. */
				const unsigned int n_mipmaps_for_layer = (texture_target == GL_TEXTURE_3D) ?
															 (m_iteration_parent_texture_n_levels - n_layer) :
															 (m_iteration_parent_texture_n_levels);

				for (unsigned int n_mipmap = 0; n_mipmap < n_mipmaps_for_layer; ++n_mipmap)
				{
					/* Use appropriate glFramebufferTexture*() API, depending on the texture target of the
					 * parent texture.
					 */
					switch (texture_target)
					{
					case GL_TEXTURE_1D:
					{
						gl.framebufferTexture1D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_1D, m_to_id,
												n_mipmap);

						GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture1D() call failed.");
						break;
					}

					case GL_TEXTURE_2D:
					case GL_TEXTURE_CUBE_MAP_NEGATIVE_X:
					case GL_TEXTURE_CUBE_MAP_NEGATIVE_Y:
					case GL_TEXTURE_CUBE_MAP_NEGATIVE_Z:
					case GL_TEXTURE_CUBE_MAP_POSITIVE_X:
					case GL_TEXTURE_CUBE_MAP_POSITIVE_Y:
					case GL_TEXTURE_CUBE_MAP_POSITIVE_Z:
					case GL_TEXTURE_RECTANGLE:
					{
						gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, texture_target, m_to_id,
												n_mipmap);

						GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");
						break;
					}

					case GL_TEXTURE_3D:
					{
						gl.framebufferTexture3D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_3D, m_to_id,
												n_mipmap, n_layer);

						GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture3D() call failed.");
						break;
					}

					default:
					{
						TCU_FAIL("Unrecognized texture target");
					}
					} /* switch (m_iteration_parent_texture_target) */

					/* Each layer/mipmap needs to be assigned an unique vec4. */
					tcu::Vec4 reference_color = getRandomReferenceColor();

					setReferenceColor(n_layer, n_texture_target, /* n_face */
									  n_mipmap, 0,				 /* n_sample */
									  reference_color);

					/* We should be OK to clear the mip-map at this point */
					gl.clearColor(reference_color.x(), reference_color.y(), reference_color.z(), reference_color.w());
					GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor() call failed.");

					gl.clear(GL_COLOR_BUFFER_BIT);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glClear() call failed.");
				} /* for (all mip-maps) */
			}	 /* for (all layers) */
		}		  /* for (all texture targets) */
	}			  /* if (!is_arrayed_texture_target && !is_multisampled_texture_target) */
	else
	{
		/* We need to handle an either multisampled or arrayed texture target or
		 * a combination of the two.
		 */
		DE_ASSERT(m_iteration_parent_texture_target == GL_TEXTURE_1D_ARRAY ||
				  m_iteration_parent_texture_target == GL_TEXTURE_2D_ARRAY ||
				  m_iteration_parent_texture_target == GL_TEXTURE_2D_MULTISAMPLE ||
				  m_iteration_parent_texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY ||
				  m_iteration_parent_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY);

		DE_ASSERT(m_iteration_parent_texture_depth >= 1);
		DE_ASSERT(m_iteration_parent_texture_n_levels >= 1);

		const unsigned int n_faces =
			(m_iteration_parent_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY) ? 6 /* faces */ : 1;

		resetReferenceColorStorage(m_iteration_parent_texture_depth,			 /* n_layers */
								   n_faces, m_iteration_parent_texture_n_levels, /* n_mipmaps */
								   m_max_color_texture_samples_gl_value);		 /* n_samples */

		/* Set up storage for reference colors the fragment shader should use
		 * when rendering to multisampled texture target */
		float* reference_colors = new float[4 /* rgba */ * m_max_color_texture_samples_gl_value];

		/* Activate the filler program */
		gl.useProgram(m_per_sample_filler_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

		/* Iterate through all layers of the texture. */
		for (unsigned int n_layer = 0; n_layer < m_iteration_parent_texture_depth; ++n_layer)
		{
			/* ..faces.. */
			for (unsigned int n_face = 0; n_face < n_faces; ++n_face)
			{
				/* ..and mip-maps, too. */
				for (unsigned int n_mipmap = 0; n_mipmap < m_iteration_parent_texture_n_levels; ++n_mipmap)
				{
					/* For all texture targets considered excl. GL_TEXTURE_2D_MULTISAMPLE, we need
					 * to use glFramebufferTextur() to bind all layers to the color atatchment. For
					 * 2DMS textures, we can use plain glFramebufferTexture2D().
					 */
					if (m_iteration_parent_texture_target != GL_TEXTURE_2D_MULTISAMPLE)
					{
						gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_to_id, n_mipmap);

						GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTextureLayer() call failed.");
					}
					else
					{
						/* Sanity check */
						DE_ASSERT(m_iteration_parent_texture_depth == 1);

						gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0,
												m_iteration_parent_texture_target, m_to_id, n_mipmap);

						GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");
					}

					/* Generate reference colors for all samples */
					const unsigned int n_samples =
						(is_multisampled_texture_target) ? m_max_color_texture_samples_gl_value : 1;

					for (unsigned int n_sample = 0; n_sample < n_samples; ++n_sample)
					{
						tcu::Vec4 reference_color = getRandomReferenceColor();

						reference_colors[4 /* rgba */ * n_sample + 0] = reference_color.x();
						reference_colors[4 /* rgba */ * n_sample + 1] = reference_color.y();
						reference_colors[4 /* rgba */ * n_sample + 2] = reference_color.z();
						reference_colors[4 /* rgba */ * n_sample + 3] = reference_color.w();

						setReferenceColor(n_layer, n_face, n_mipmap, n_sample, reference_color);
					} /* for (all samples) */

					/* Upload the reference sample colors */
					gl.uniform4fv(m_per_sample_filler_po_reference_colors_location, n_samples, reference_colors);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform4fv() call failed.");

					/* Update the layer ID the program should render to */
					const unsigned int layer_id = n_face * 6 /* faces */ + n_layer;

					gl.uniform1i(m_per_sample_filler_po_layer_id_location, layer_id);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i() call failed.");

					/* Draw the full-screen quad. Geometry shader will draw the quad for us,
					 * so all we need to do is to feed the rendering pipeline with a single
					 * point.
					 */
					gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
				} /* for (all mip-maps) */
			}	 /* for (all faces) */
		}		  /* for (all layers) */

		delete[] reference_colors;
	}
}